

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

int __thiscall
glcts::TextureCubeMapArraySamplingTest::programDefinition::link
          (programDefinition *this,char *__from,char *__to)

{
  GLenum GVar1;
  undefined8 uVar2;
  undefined8 extraout_RAX;
  GLint local_1c;
  programDefinition *ppStack_18;
  GLint linkStatus;
  programDefinition *this_local;
  
  uVar2 = 0;
  if (this->m_program_object_id == 0) {
    this_local._7_1_ = 0;
  }
  else {
    ppStack_18 = this;
    if (this->compute_shader != (shaderDefinition *)0x0) {
      shaderDefinition::attach(this->compute_shader,this->m_program_object_id);
    }
    if (this->geometry_shader != (shaderDefinition *)0x0) {
      shaderDefinition::attach(this->geometry_shader,this->m_program_object_id);
    }
    if (this->fragment_shader != (shaderDefinition *)0x0) {
      shaderDefinition::attach(this->fragment_shader,this->m_program_object_id);
    }
    if (this->tesselation_control_shader != (shaderDefinition *)0x0) {
      shaderDefinition::attach(this->tesselation_control_shader,this->m_program_object_id);
    }
    if (this->tesselation_evaluation_shader != (shaderDefinition *)0x0) {
      shaderDefinition::attach(this->tesselation_evaluation_shader,this->m_program_object_id);
    }
    if (this->vertex_shader != (shaderDefinition *)0x0) {
      shaderDefinition::attach(this->vertex_shader,this->m_program_object_id);
    }
    (*this->m_gl->linkProgram)(this->m_program_object_id);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glLinkProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                    ,0x11c9);
    local_1c = 0;
    (*this->m_gl->getProgramiv)(this->m_program_object_id,0x8b82,&local_1c);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glGetProgramiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                    ,0x11ce);
    uVar2 = extraout_RAX;
    if (local_1c == 0) {
      this_local._7_1_ = 0;
    }
    else {
      this_local._7_1_ = 1;
    }
  }
  return (int)CONCAT71((int7)((ulong)uVar2 >> 8),this_local._7_1_);
}

Assistant:

bool TextureCubeMapArraySamplingTest::programDefinition::link()
{
	if (m_invalid_program_object_id == m_program_object_id)
	{
		return false;
	}

	if (0 != compute_shader)
	{
		compute_shader->attach(m_program_object_id);
	}

	if (0 != geometry_shader)
	{
		geometry_shader->attach(m_program_object_id);
	}

	if (0 != fragment_shader)
	{
		fragment_shader->attach(m_program_object_id);
	}

	if (0 != tesselation_control_shader)
	{
		tesselation_control_shader->attach(m_program_object_id);
	}

	if (0 != tesselation_evaluation_shader)
	{
		tesselation_evaluation_shader->attach(m_program_object_id);
	}

	if (0 != vertex_shader)
	{
		vertex_shader->attach(m_program_object_id);
	}

	/* Link Program */
	m_gl->linkProgram(m_program_object_id);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "glLinkProgram() call failed.");

	/* Check linking status */
	glw::GLint linkStatus = GL_FALSE;
	m_gl->getProgramiv(m_program_object_id, GL_LINK_STATUS, &linkStatus);
	GLU_EXPECT_NO_ERROR(m_gl->getError(), "glGetProgramiv() call failed.");

	if (linkStatus == GL_FALSE)
	{
		return false;
	}

	return true;
}